

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTestingFixture.cpp
# Opt level: O3

void __thiscall TestTestingFixture::TestTestingFixture(TestTestingFixture *this)

{
  StringBufferTestOutput *this_00;
  TestResult *this_01;
  ExecFunctionTestShell *this_02;
  TestRegistry *this_03;
  
  this->_vptr_TestTestingFixture = (_func_int **)&PTR__TestTestingFixture_002e94d8;
  this_00 = (StringBufferTestOutput *)
            operator_new(0x30,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTest/TestTestingFixture.cpp"
                         ,0x23);
  StringBufferTestOutput::StringBufferTestOutput(this_00);
  this->output_ = this_00;
  this_01 = (TestResult *)
            operator_new(0x70,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTest/TestTestingFixture.cpp"
                         ,0x24);
  TestResult::TestResult(this_01,&this->output_->super_TestOutput);
  this->result_ = this_01;
  this_02 = (ExecFunctionTestShell *)
            operator_new(0x50,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTest/TestTestingFixture.cpp"
                         ,0x25);
  UtestShell::UtestShell((UtestShell *)this_02,"ExecFunction","ExecFunction","ExecFunction",1);
  (this_02->super_UtestShell)._vptr_UtestShell = (_func_int **)&PTR__ExecFunctionTestShell_002e9958;
  this_02->setup_ = (_func_void *)0x0;
  this_02->teardown_ = (_func_void *)0x0;
  this_02->testFunction_ = (ExecFunction *)0x0;
  this->genTest_ = this_02;
  this_03 = (TestRegistry *)
            operator_new(0x38,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTest/TestTestingFixture.cpp"
                         ,0x26);
  TestRegistry::TestRegistry(this_03);
  this->registry_ = this_03;
  this->ownsExecFunction_ = false;
  (*this_03->_vptr_TestRegistry[0x17])(this_03,this_03);
  (*this->registry_->_vptr_TestRegistry[2])(this->registry_,this->genTest_);
  lineOfCodeExecutedAfterCheck = false;
  return;
}

Assistant:

TestTestingFixture::TestTestingFixture()
{
    output_ = new StringBufferTestOutput();
    result_ = new TestResult(*output_);
    genTest_ = new ExecFunctionTestShell();
    registry_ = new TestRegistry();
    ownsExecFunction_ = false;

    registry_->setCurrentRegistry(registry_);
    registry_->addTest(genTest_);

    lineOfCodeExecutedAfterCheck = false;
}